

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

MODSTRUCT * LOADAddModule(void *dl_handle,LPCSTR libraryNameOrPath)

{
  PDLLMAIN p_Var1;
  MODSTRUCT *local_28;
  MODSTRUCT *module;
  LPCSTR libraryNameOrPath_local;
  void *dl_handle_local;
  
  if (dl_handle == (void *)0x0) {
    fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
            ,0x5ac,"dl_handle != nullptr","");
    fflush(_stderr);
    abort();
  }
  if (libraryNameOrPath == (LPCSTR)0x0) {
    fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
            ,0x5ad,"libraryNameOrPath != nullptr","");
    fflush(_stderr);
    abort();
  }
  if (*libraryNameOrPath == '\0') {
    fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
            ,0x5ae,"libraryNameOrPath[0] != \'\\0\'","");
    fflush(_stderr);
    abort();
  }
  local_28 = &exe_module;
  do {
    if (dl_handle == local_28->dl_handle) {
      if (PAL_InitializeChakraCoreCalled) {
        if (local_28->refcount != -1) {
          local_28->refcount = local_28->refcount + 1;
        }
        dlclose(dl_handle);
        return local_28;
      }
      abort();
    }
    local_28 = local_28->next;
  } while (local_28 != &exe_module);
  if (PAL_InitializeChakraCoreCalled) {
    dl_handle_local = LOADAllocModule(dl_handle,libraryNameOrPath);
    if ((MODSTRUCT *)dl_handle_local == (MODSTRUCT *)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SetLastError(8);
      dlclose(dl_handle);
      dl_handle_local = (void *)0x0;
    }
    else {
      p_Var1 = (PDLLMAIN)dlsym(((MODSTRUCT *)dl_handle_local)->dl_handle,"DllMain");
      ((MODSTRUCT *)dl_handle_local)->pDllMain = p_Var1;
      ((MODSTRUCT *)dl_handle_local)->prev = exe_module.prev;
      ((MODSTRUCT *)dl_handle_local)->next = &exe_module;
      (exe_module.prev)->next = (_MODSTRUCT *)dl_handle_local;
      exe_module.prev = (_MODSTRUCT *)dl_handle_local;
    }
    return (MODSTRUCT *)dl_handle_local;
  }
  abort();
}

Assistant:

static MODSTRUCT *LOADAddModule(void *dl_handle, LPCSTR libraryNameOrPath)
{
    _ASSERTE(dl_handle != nullptr);
    _ASSERTE(libraryNameOrPath != nullptr);
    _ASSERTE(libraryNameOrPath[0] != '\0');

#if !RETURNS_NEW_HANDLES_ON_REPEAT_DLOPEN
    /* search module list for a match. */
    MODSTRUCT *module = &exe_module;
    do
    {
        if (dl_handle == module->dl_handle)
        {
            /* found the handle. increment the refcount and return the
               existing module structure */
            TRACE("Found matching module %p for module name %s\n", module, libraryNameOrPath);

            if (module->refcount != -1)
            {
                module->refcount++;
            }
            dlclose(dl_handle);
            return module;
        }
        module = module->next;

    } while (module != &exe_module);
#endif

    TRACE("Module doesn't exist : creating %s.\n", libraryNameOrPath);

    module = LOADAllocModule(dl_handle, libraryNameOrPath);
    if (nullptr == module)
    {
        ERROR("couldn't create new module\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        dlclose(dl_handle);
        return nullptr;
    }

    /* We now get the address of DllMain if the module contains one. */
    module->pDllMain = (PDLLMAIN)dlsym(module->dl_handle, "DllMain");

    /* Add the new module on to the end of the list */
    module->prev = exe_module.prev;
    module->next = &exe_module;
    exe_module.prev->next = module;
    exe_module.prev = module;

#if RETURNS_NEW_HANDLES_ON_REPEAT_DLOPEN
    module->inode = stat_buf.st_ino;
    module->device = stat_buf.st_dev;
#endif

    return module;
}